

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMRangeImpl::insertNode(DOMRangeImpl *this,DOMNode *newNode)

{
  DOMDocument *pDVar1;
  XMLSize_t offset;
  DOMProcessingInstructionImpl *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  uint uVar3;
  int iVar4;
  DOMNodeImpl *pDVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNode *pDVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMException *this_01;
  code *pcVar8;
  pointer_____offset_0x10___ *ppuVar9;
  XMLSize_t i;
  ulong uVar10;
  DOMNode *pDVar6;
  undefined4 extraout_var_02;
  
  if (newNode == (DOMNode *)0x0) {
    return;
  }
  if (this->fDetached == true) {
    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_01,0xb,0,this->fMemoryManager);
  }
  else {
    uVar3 = (*newNode->_vptr_DOMNode[4])(newNode);
    if ((uVar3 < 0xd) && ((0x1244U >> (uVar3 & 0x1f) & 1) != 0)) {
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMRangeException::DOMRangeException((DOMRangeException *)this_01,0x70,0,this->fMemoryManager)
      ;
      ppuVar9 = &DOMRangeException::typeinfo;
      pcVar8 = DOMRangeException::~DOMRangeException;
      goto LAB_0028804a;
    }
    bVar2 = isAncestorOf(newNode,this->fStartContainer);
    if (bVar2) {
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_01,3,0,this->fMemoryManager);
    }
    else {
      pDVar6 = this->fStartContainer;
      while (pDVar6 != (DOMNode *)0x0) {
        pDVar5 = castToNodeImpl(newNode);
        if ((pDVar5->flags & 1) != 0) {
          this_01 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(this_01,7,0,this->fMemoryManager);
          goto LAB_0028803c;
        }
        iVar4 = (*pDVar6->_vptr_DOMNode[5])(pDVar6);
        pDVar6 = (DOMNode *)CONCAT44(extraout_var,iVar4);
      }
      pDVar1 = this->fDocument;
      iVar4 = (*newNode->_vptr_DOMNode[0xc])(newNode);
      if (pDVar1 == (DOMDocument *)CONCAT44(extraout_var_00,iVar4)) {
        uVar3 = (*this->fStartContainer->_vptr_DOMNode[4])();
        if ((uVar3 < 9) && ((0x198U >> (uVar3 & 0x1f) & 1) != 0)) {
          iVar4 = (*this->fStartContainer->_vptr_DOMNode[5])();
          pDVar6 = (DOMNode *)CONCAT44(extraout_var_01,iVar4);
          offset = this->fStartOffset;
          if (offset != 0) {
            this_00 = (DOMProcessingInstructionImpl *)this->fStartContainer;
            if (uVar3 == 7) {
              DOMProcessingInstructionImpl::splitText(this_00,offset);
            }
            else if (uVar3 == 8) {
              DOMCommentImpl::splitText((DOMCommentImpl *)this_00,offset);
            }
            else {
              (*(this_00->super_DOMProcessingInstruction).super_DOMNode._vptr_DOMNode[0x30])();
            }
            if (this->fStartOffset != 0) {
              iVar4 = (*this->fStartContainer->_vptr_DOMNode[10])();
              pDVar7 = (DOMNode *)CONCAT44(extraout_var_04,iVar4);
              goto LAB_00287fdc;
            }
          }
          pDVar7 = this->fStartContainer;
        }
        else {
          pDVar6 = this->fStartContainer;
          iVar4 = (*pDVar6->_vptr_DOMNode[7])(pDVar6);
          pDVar7 = (DOMNode *)CONCAT44(extraout_var_02,iVar4);
          for (uVar10 = 0; (pDVar7 != (DOMNode *)0x0 && (uVar10 < this->fStartOffset));
              uVar10 = uVar10 + 1) {
            iVar4 = (*pDVar7->_vptr_DOMNode[10])(pDVar7);
            pDVar7 = (DOMNode *)CONCAT44(extraout_var_03,iVar4);
          }
        }
LAB_00287fdc:
        if (pDVar6 == (DOMNode *)0x0) {
          return;
        }
        if (pDVar7 == (DOMNode *)0x0) {
          (*pDVar6->_vptr_DOMNode[0x11])(pDVar6,newNode);
          return;
        }
        UNRECOVERED_JUMPTABLE = pDVar6->_vptr_DOMNode[0xe];
        (*UNRECOVERED_JUMPTABLE)(pDVar6,newNode,pDVar7,UNRECOVERED_JUMPTABLE);
        return;
      }
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_01,4,0,this->fMemoryManager);
    }
  }
LAB_0028803c:
  ppuVar9 = &DOMException::typeinfo;
  pcVar8 = DOMException::~DOMException;
LAB_0028804a:
  __cxa_throw(this_01,ppuVar9,pcVar8);
}

Assistant:

void DOMRangeImpl::insertNode(DOMNode* newNode)
{
    if (newNode == 0) return; //don't have to do anything

    if( fDetached) {
        throw DOMException(
            DOMException::INVALID_STATE_ERR, 0, fMemoryManager);
    }

    int type = newNode->getNodeType();
    if (type == DOMNode::ATTRIBUTE_NODE
        || type == DOMNode::ENTITY_NODE
        || type == DOMNode::NOTATION_NODE
        || type == DOMNode::DOCUMENT_NODE)
    {
        throw DOMRangeException(
            DOMRangeException::INVALID_NODE_TYPE_ERR, 0, fMemoryManager);
    }

    // Prevent cycles in the tree.
    //isKidOK() is not checked here as its taken care by insertBefore() function
    if (isAncestorOf( newNode, fStartContainer)) {
        throw DOMException(
            DOMException::HIERARCHY_REQUEST_ERR, 0, fMemoryManager);
    }

    for (DOMNode* aNode = fStartContainer; aNode!=0; aNode = aNode->getParentNode()) {
        if (castToNodeImpl(newNode)->isReadOnly()) {
        throw DOMException(
            DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, fMemoryManager);
    }
    }

    if (fDocument != newNode->getOwnerDocument()) {
        throw DOMException(
            DOMException::WRONG_DOCUMENT_ERR, 0, fMemoryManager);
    }


    DOMNode* parent;
    DOMNode* next;

    type = fStartContainer->getNodeType();
    if((type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE)) {

        //set 'parent' and 'next' here
        parent = fStartContainer->getParentNode();

        //split the text nodes
       if (fStartOffset > 0) {
           if (type == DOMNode::COMMENT_NODE)
               ((DOMCommentImpl*)fStartContainer)->splitText(fStartOffset);
           else if (type == DOMNode::PROCESSING_INSTRUCTION_NODE)
               ((DOMProcessingInstructionImpl*)fStartContainer)->splitText(fStartOffset);
           else
               ((DOMText*)fStartContainer)->splitText(fStartOffset);
       }

        //update the new start information later. After inserting the first newNode
        if (fStartOffset == 0)
            next = fStartContainer;
        else
            next = fStartContainer->getNextSibling();

    } // end of text handling
    else {
        parent = fStartContainer;

        next = fStartContainer->getFirstChild();
        for(XMLSize_t i = 0; (i < fStartOffset) && (next != 0); i++) {
            next=next->getNextSibling();
        }
    }

    if (parent != 0) {
        if (next != 0)
            parent->insertBefore(newNode, next);
        else
            parent->appendChild(newNode);
    }
}